

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__skip_jpeg_junk_at_end(stbi__jpeg *j)

{
  byte bVar1;
  int iVar2;
  int x;
  undefined4 in_stack_ffffffffffffffe8;
  uint in_stack_ffffffffffffffec;
  
  do {
    iVar2 = stbi__at_eof((stbi__context *)
                         CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    if (iVar2 != 0) {
      return 0xff;
    }
    bVar1 = stbi__get8((stbi__context *)
                       CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    in_stack_ffffffffffffffec = (uint)bVar1;
    while (in_stack_ffffffffffffffec == 0xff) {
      iVar2 = stbi__at_eof((stbi__context *)CONCAT44(0xff,in_stack_ffffffffffffffe8));
      if (iVar2 != 0) {
        return 0xff;
      }
      bVar1 = stbi__get8((stbi__context *)
                         CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
      in_stack_ffffffffffffffec = (uint)bVar1;
      if ((in_stack_ffffffffffffffec != 0) && (in_stack_ffffffffffffffec != 0xff)) {
        return in_stack_ffffffffffffffec;
      }
    }
  } while( true );
}

Assistant:

static int stbi__skip_jpeg_junk_at_end(stbi__jpeg *j)
{
   // some JPEGs have junk at end, skip over it but if we find what looks
   // like a valid marker, resume there
   while (!stbi__at_eof(j->s)) {
      int x = stbi__get8(j->s);
      while (x == 255) { // might be a marker
         if (stbi__at_eof(j->s)) return STBI__MARKER_none;
         x = stbi__get8(j->s);
         if (x != 0x00 && x != 0xff) {
            // not a stuffed zero or lead-in to another marker, looks
            // like an actual marker, return it
            return x;
         }
         // stuffed zero has x=0 now which ends the loop, meaning we go
         // back to regular scan loop.
         // repeated 0xff keeps trying to read the next byte of the marker.
      }
   }
   return STBI__MARKER_none;
}